

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EnumValueSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
          (BumpAllocator *this,char **args,SourceLocation *args_1)

{
  char *__s;
  EnumValueSymbol *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (EnumValueSymbol *)allocate(this,0x98,8);
  __s = *args;
  sVar1 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar1;
  ast::EnumValueSymbol::EnumValueSymbol(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }